

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Maj3_ManExactSynthesis(int nVars,int nNodes,int fVerbose,Vec_Int_t *vLevels)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  uint local_40;
  int iMint;
  int nLazyAll;
  int nLazy;
  int status;
  int i;
  abctime clkTotal;
  Maj3_Man_t *p;
  Vec_Int_t *vLevels_local;
  uint local_10;
  int fVerbose_local;
  int nNodes_local;
  int nVars_local;
  
  p = (Maj3_Man_t *)vLevels;
  vLevels_local._4_4_ = fVerbose;
  local_10 = nNodes;
  fVerbose_local = nVars;
  _status = Abc_Clock();
  local_40 = 0;
  clk._4_4_ = 0;
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
         (ulong)(uint)fVerbose_local,(ulong)local_10);
  clkTotal = (abctime)Maj3_ManAlloc(fVerbose_local,local_10,(Vec_Int_t *)p);
  nLazy = 0;
  do {
    if (clk._4_4_ == -1) {
LAB_0070a226:
      if (clk._4_4_ == -1) {
        Maj3_ManPrintSolution((Maj3_Man_t *)clkTotal);
      }
      Maj3_ManFree((Maj3_Man_t *)clkTotal);
      aVar3 = Abc_Clock();
      Abc_PrintTime(1,"Total runtime",aVar3 - _status);
      return (int)(clk._4_4_ == -1);
    }
    aVar3 = Abc_Clock();
    iVar1 = Maj3_ManAddCnf((Maj3_Man_t *)clkTotal,clk._4_4_);
    if (iVar1 == 0) goto LAB_0070a226;
    while (nLazyAll = bmcg_sat_solver_solve(*(bmcg_sat_solver **)(clkTotal + 0x11b8),(int *)0x0,0),
          nLazyAll == 1) {
      iMint = Maj3_ManAddConstraintsLazy((Maj3_Man_t *)clkTotal);
      if (iMint == -1) {
        printf("Became UNSAT after adding lazy constraints.\n");
        nLazyAll = -1;
        break;
      }
      if (iMint == 0) break;
      local_40 = iMint + local_40;
    }
    if (vLevels_local._4_4_ != 0) {
      printf("Iter %3d : ",(ulong)(uint)nLazy);
      Extra_PrintBinary(_stdout,(uint *)((long)&clk + 4),*(int *)clkTotal);
      printf("  Var =%5d  ",(ulong)*(uint *)(clkTotal + 0x10));
      uVar2 = bmcg_sat_solver_clausenum(*(bmcg_sat_solver **)(clkTotal + 0x11b8));
      printf("Cla =%6d  ",(ulong)uVar2);
      uVar2 = bmcg_sat_solver_conflictnum(*(bmcg_sat_solver **)(clkTotal + 0x11b8));
      printf("Conf =%9d  ",(ulong)uVar2);
      printf("Lazy =%9d  ",(ulong)local_40);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - aVar3);
    }
    if (nLazyAll == -1) {
      printf("The problem has no solution.\n");
      goto LAB_0070a226;
    }
    clk._4_4_ = Maj3_ManEval((Maj3_Man_t *)clkTotal);
    nLazy = nLazy + 1;
  } while( true );
}

Assistant:

int Maj3_ManExactSynthesis( int nVars, int nNodes, int fVerbose, Vec_Int_t * vLevels )
{
    Maj3_Man_t * p;  abctime clkTotal = Abc_Clock();
    int i, status, nLazy, nLazyAll = 0, iMint = 0;
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", nVars, nNodes );
    p = Maj3_ManAlloc( nVars, nNodes, vLevels );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj3_ManAddCnf( p, iMint ) )
            break;
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            nLazy = Maj3_ManAddConstraintsLazy( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            printf( "Lazy =%9d  ", nLazyAll );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj3_ManEval( p );
    }
    if ( iMint == -1 )
        Maj3_ManPrintSolution( p );
    Maj3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}